

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerHLSL::read_access_chain
          (CompilerHLSL *this,string *expr,string *lhs,SPIRAccessChain *chain)

{
  string *psVar1;
  CompilerHLSL *this_00;
  bool bVar2;
  SPIRType *type;
  CompilerError *pCVar3;
  uint uVar4;
  char (*in_R8) [2];
  string *in_R9;
  uint uVar5;
  uint uVar6;
  char (*pacVar7) [2];
  SPIRType *pSVar8;
  string local_3a0;
  SPIRAccessChain *local_380;
  char *local_378;
  uint local_36c;
  string load_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  CompilerHLSL *local_328;
  string template_expr;
  string base;
  SPIRType scalar_type;
  undefined1 local_180 [192];
  uint *local_c0;
  size_t local_b8;
  size_t local_b0;
  uint local_a8 [8];
  undefined1 local_88 [28];
  TypeID local_6c;
  __node_base_ptr *local_68;
  size_type local_60;
  __node_base local_58;
  size_type sStack_50;
  float local_48;
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  type = Compiler::get<spirv_cross::SPIRType>
                   ((Compiler *)this,*(uint32_t *)&(chain->super_IVariant).field_0xc);
  bVar2 = Compiler::is_scalar((Compiler *)this,type);
  if (bVar2) {
    local_180._12_4_ = 0x15;
  }
  else {
    local_180._12_4_ = *(undefined4 *)&(type->super_IVariant).field_0xc;
  }
  local_180._32_8_ = local_180 + 0x38;
  local_180._8_4_ = 0;
  local_180._0_8_ = &PTR__SPIRType_004e8f68;
  local_180._20_4_ = 0;
  local_180._40_8_ = 0;
  local_180._48_8_ = 8;
  local_180._88_8_ = local_180 + 0x70;
  local_180._96_8_ = 0;
  local_180._104_8_ = 8;
  local_180._120_4_ = 0;
  local_180[0x7c] = false;
  local_180[0x7d] = false;
  local_180._16_4_ = UInt;
  local_180._136_8_ = local_180 + 0xa0;
  local_180._144_8_ = 0;
  local_180._152_8_ = 8;
  local_c0 = local_a8;
  local_b8 = 0;
  local_b0 = 8;
  local_68 = &p_Stack_38;
  local_88._0_7_ = 0;
  local_88._7_4_ = 0;
  local_6c.id = 0;
  local_88._12_4_ = 0;
  local_88._16_4_ = ImageFormatUnknown;
  local_88._20_4_ = AccessQualifierReadOnly;
  local_88._24_4_ = 0;
  local_60 = 1;
  local_58._M_nxt = (_Hash_node_base *)0x0;
  sStack_50 = 0;
  local_48 = 1.0;
  local_40 = 0;
  p_Stack_38 = (__node_base_ptr)0x0;
  local_180._24_4_ = type->vecsize;
  local_180._28_4_ = type->columns;
  local_180._128_4_ = local_180._16_4_;
  if ((type->array).super_VectorView<unsigned_int>.buffer_size != 0) {
    read_access_chain_array(this,lhs,chain);
    goto LAB_0020ed20;
  }
  if (type->basetype == Struct) {
    read_access_chain_struct(this,lhs,chain);
    goto LAB_0020ed20;
  }
  if ((type->width != 0x20) && ((this->hlsl_options).enable_16bit_types == false)) {
    pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (pCVar3,
               "Reading types other than 32-bit from ByteAddressBuffer not yet supported, unless SM 6.2 and native 16-bit types are enabled."
              );
    __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::string((string *)&base,(string *)&chain->base);
  pacVar7 = (char (*) [2])0x20e446;
  bVar2 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(chain->super_IVariant).self.id,DecorationNonUniform);
  if (bVar2) {
    pacVar7 = (char (*) [2])0x20e45d;
    CompilerGLSL::convert_non_uniform_expression
              (&this->super_CompilerGLSL,&base,(chain->super_IVariant).self.id);
  }
  local_36c = (this->hlsl_options).shader_model;
  load_expr._M_dataplus._M_p = (pointer)&load_expr.field_2;
  load_expr._M_string_length = 0;
  template_expr._M_dataplus._M_p = (pointer)&template_expr.field_2;
  template_expr._M_string_length = 0;
  load_expr.field_2._M_local_buf[0] = '\0';
  template_expr.field_2._M_local_buf[0] = '\0';
  if (0x3d < local_36c) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_3a0,this,type,0);
    join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              ((string *)&scalar_type,(spirv_cross *)0x3565d7,(char (*) [2])&local_3a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39c368,in_R8);
    ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&scalar_type);
    ::std::__cxx11::string::~string((string *)&scalar_type);
    pacVar7 = (char (*) [2])0x20e4f4;
    ::std::__cxx11::string::~string((string *)&local_3a0);
  }
  local_380 = chain;
  local_328 = this;
  if (type->columns == 1) {
    if (chain->row_major_matrix == false) {
      switch(type->vecsize) {
      case 1:
        local_3a0._M_dataplus._M_p = "Load";
        break;
      case 2:
        local_3a0._M_dataplus._M_p = "Load2";
        break;
      case 3:
        local_3a0._M_dataplus._M_p = "Load3";
        break;
      case 4:
        local_3a0._M_dataplus._M_p = "Load4";
        break;
      default:
        pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar3,"Unknown vector size.");
        __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (0x3d < local_36c) {
        local_3a0._M_dataplus._M_p = "Load";
      }
      in_R9 = (string *)0x39e911;
      join<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,int_const&,char_const(&)[2]>
                ((string *)&scalar_type,(spirv_cross *)&base,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x352557,
                 (char (*) [2])&local_3a0,(char **)&template_expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39e911,
                 (char (*) [2])&chain->dynamic_index,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &chain->static_index,(int *)0x3a9fc7,pacVar7);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
      ::std::__cxx11::string::~string((string *)&scalar_type);
    }
    else {
      if (local_36c < 0x3e) {
        if (1 < type->vecsize) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&scalar_type,this,local_180,0);
          ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
          ::std::__cxx11::string::~string((string *)&scalar_type);
          ::std::__cxx11::string::append((char *)&load_expr);
        }
      }
      else {
        pSVar8 = type;
        SPIRType::SPIRType(&scalar_type,type);
        scalar_type.vecsize = 1;
        scalar_type.columns = 1;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_348,this,&scalar_type,0);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_3a0,(spirv_cross *)0x3565d7,(char (*) [2])&local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39c368,
                   in_R8);
        ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&local_3a0);
        ::std::__cxx11::string::~string((string *)&local_3a0);
        ::std::__cxx11::string::~string((string *)&local_348);
        if (1 < type->vecsize) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_348,this,type,0);
          ::std::operator+(&local_3a0,&local_348,"(");
          ::std::__cxx11::string::append((string *)&load_expr);
          ::std::__cxx11::string::~string((string *)&local_3a0);
          ::std::__cxx11::string::~string((string *)&local_348);
        }
        type = pSVar8;
        SPIRType::~SPIRType(&scalar_type);
      }
      psVar1 = &local_380->dynamic_index;
      uVar6 = 0;
      while (uVar6 < type->vecsize) {
        local_3a0._M_dataplus._M_p._0_4_ =
             local_380->matrix_stride * uVar6 + local_380->static_index;
        in_R9 = psVar1;
        join<std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                  ((string *)&scalar_type,(spirv_cross *)&base,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".Load",
                   (char (*) [6])&template_expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39e911,
                   (char (*) [2])psVar1,&local_3a0,(uint *)0x3a9fc7,(char (*) [2])type);
        ::std::__cxx11::string::append((string *)&load_expr);
        ::std::__cxx11::string::~string((string *)&scalar_type);
        uVar6 = uVar6 + 1;
        if (uVar6 < type->vecsize) {
          ::std::__cxx11::string::append((char *)&load_expr);
        }
      }
      if (1 < type->vecsize) goto LAB_0020e856;
    }
  }
  else if (chain->row_major_matrix == false) {
    switch(type->vecsize) {
    case 1:
      local_378 = "Load";
      break;
    case 2:
      local_378 = "Load2";
      break;
    case 3:
      local_378 = "Load3";
      break;
    case 4:
      local_378 = "Load4";
      break;
    default:
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar3,"Unknown vector size.");
      __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (local_36c < 0x3e) {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&scalar_type,this,local_180,0);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
      ::std::__cxx11::string::~string((string *)&scalar_type);
    }
    else {
      pSVar8 = type;
      SPIRType::SPIRType(&scalar_type,type);
      scalar_type.columns = 1;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&local_348,this,&scalar_type,0);
      join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (&local_3a0,(spirv_cross *)0x3565d7,(char (*) [2])&local_348,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39c368,in_R8
                );
      ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&local_3a0);
      ::std::__cxx11::string::~string((string *)&local_3a0);
      ::std::__cxx11::string::~string((string *)&local_348);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_3a0,this,type,0);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&local_3a0);
      ::std::__cxx11::string::~string((string *)&local_3a0);
      local_378 = "Load";
      SPIRType::~SPIRType(&scalar_type);
      type = pSVar8;
    }
    pacVar7 = (char (*) [2])0x20eb66;
    ::std::__cxx11::string::append((char *)&load_expr);
    uVar6 = 0;
    while (uVar6 < type->columns) {
      local_3a0._M_dataplus._M_p._0_4_ = local_380->matrix_stride * uVar6 + local_380->static_index;
      in_R9 = (string *)0x39e911;
      join<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                ((string *)&scalar_type,(spirv_cross *)&base,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x352557,
                 (char (*) [2])&local_378,(char **)&template_expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39e911,
                 (char (*) [2])&chain->dynamic_index,&local_3a0,(uint *)0x3a9fc7,pacVar7);
      ::std::__cxx11::string::append((string *)&load_expr);
      pacVar7 = (char (*) [2])0x20ebf7;
      ::std::__cxx11::string::~string((string *)&scalar_type);
      uVar6 = uVar6 + 1;
      if (uVar6 < type->columns) {
        pacVar7 = (char (*) [2])0x20ec13;
        ::std::__cxx11::string::append((char *)&load_expr);
      }
    }
    ::std::__cxx11::string::append((char *)&load_expr);
  }
  else {
    pSVar8 = type;
    if (local_36c < 0x3e) {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&scalar_type,this,local_180,0);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
      ::std::__cxx11::string::~string((string *)&scalar_type);
    }
    else {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&scalar_type,this,type,0);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
      ::std::__cxx11::string::~string((string *)&scalar_type);
      SPIRType::SPIRType(&scalar_type,type);
      scalar_type.vecsize = 1;
      scalar_type.columns = 1;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&local_348,this,&scalar_type,0);
      join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (&local_3a0,(spirv_cross *)0x3565d7,(char (*) [2])&local_348,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39c368,in_R8
                );
      ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&local_3a0);
      ::std::__cxx11::string::~string((string *)&local_3a0);
      ::std::__cxx11::string::~string((string *)&local_348);
      SPIRType::~SPIRType(&scalar_type);
    }
    ::std::__cxx11::string::append((char *)&load_expr);
    psVar1 = &local_380->dynamic_index;
    uVar6 = 0;
    while (uVar4 = uVar6, uVar4 < type->columns) {
      uVar5 = 0;
      type = pSVar8;
      while (uVar6 = uVar4 + 1, pSVar8 = type, uVar5 < type->vecsize) {
        local_3a0._M_dataplus._M_p._0_4_ =
             local_380->matrix_stride * uVar5 + (type->width >> 3) * uVar4 + local_380->static_index
        ;
        in_R9 = psVar1;
        join<std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                  ((string *)&scalar_type,(spirv_cross *)&base,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".Load",
                   (char (*) [6])&template_expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39e911,
                   (char (*) [2])psVar1,&local_3a0,(uint *)0x3a9fc7,(char (*) [2])type);
        ::std::__cxx11::string::append((string *)&load_expr);
        ::std::__cxx11::string::~string((string *)&scalar_type);
        uVar5 = uVar5 + 1;
        if ((uVar5 < type->vecsize) || (uVar4 + 1 < type->columns)) {
          ::std::__cxx11::string::append((char *)&load_expr);
        }
      }
    }
LAB_0020e856:
    ::std::__cxx11::string::append((char *)&load_expr);
  }
  this_00 = local_328;
  if (local_36c < 0x3e) {
    (*(local_328->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3b])
              (&scalar_type,local_328,type,local_180);
    if (scalar_type.super_IVariant._8_8_ != 0) {
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (&local_3a0,(spirv_cross *)&scalar_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39e911,
                 (char (*) [2])&load_expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a9fc7,
                 (char (*) [2])in_R9);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&local_3a0);
      ::std::__cxx11::string::~string((string *)&local_3a0);
    }
    ::std::__cxx11::string::~string((string *)&scalar_type);
  }
  if (lhs->_M_string_length == 0) {
    if (expr == (string *)0x0) {
      __assert_fail("expr",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_hlsl.cpp"
                    ,0x1277,
                    "void spirv_cross::CompilerHLSL::read_access_chain(string *, const string &, const SPIRAccessChain &)"
                   );
    }
    ::std::__cxx11::string::operator=((string *)expr,(string *)&load_expr);
  }
  else {
    CompilerGLSL::
    statement<std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
              (&this_00->super_CompilerGLSL,lhs,(char (*) [4])0x39e275,&load_expr,
               (char (*) [2])0x3a919d);
  }
  ::std::__cxx11::string::~string((string *)&template_expr);
  ::std::__cxx11::string::~string((string *)&load_expr);
  ::std::__cxx11::string::~string((string *)&base);
LAB_0020ed20:
  SPIRType::~SPIRType((SPIRType *)local_180);
  return;
}

Assistant:

void CompilerHLSL::read_access_chain(string *expr, const string &lhs, const SPIRAccessChain &chain)
{
	auto &type = get<SPIRType>(chain.basetype);

	SPIRType target_type { is_scalar(type) ? OpTypeInt : type.op };
	target_type.basetype = SPIRType::UInt;
	target_type.vecsize = type.vecsize;
	target_type.columns = type.columns;

	if (!type.array.empty())
	{
		read_access_chain_array(lhs, chain);
		return;
	}
	else if (type.basetype == SPIRType::Struct)
	{
		read_access_chain_struct(lhs, chain);
		return;
	}
	else if (type.width != 32 && !hlsl_options.enable_16bit_types)
		SPIRV_CROSS_THROW("Reading types other than 32-bit from ByteAddressBuffer not yet supported, unless SM 6.2 and "
		                  "native 16-bit types are enabled.");

	string base = chain.base;
	if (has_decoration(chain.self, DecorationNonUniform))
		convert_non_uniform_expression(base, chain.self);

	bool templated_load = hlsl_options.shader_model >= 62;
	string load_expr;

	string template_expr;
	if (templated_load)
		template_expr = join("<", type_to_glsl(type), ">");

	// Load a vector or scalar.
	if (type.columns == 1 && !chain.row_major_matrix)
	{
		const char *load_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			load_op = "Load";
			break;
		case 2:
			load_op = "Load2";
			break;
		case 3:
			load_op = "Load3";
			break;
		case 4:
			load_op = "Load4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_load)
			load_op = "Load";

		load_expr = join(base, ".", load_op, template_expr, "(", chain.dynamic_index, chain.static_index, ")");
	}
	else if (type.columns == 1)
	{
		// Strided load since we are loading a column from a row-major matrix.
		if (templated_load)
		{
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
			if (type.vecsize > 1)
				load_expr += type_to_glsl(type) + "(";
		}
		else if (type.vecsize > 1)
		{
			load_expr = type_to_glsl(target_type);
			load_expr += "(";
		}

		for (uint32_t r = 0; r < type.vecsize; r++)
		{
			load_expr += join(base, ".Load", template_expr, "(", chain.dynamic_index,
			                  chain.static_index + r * chain.matrix_stride, ")");
			if (r + 1 < type.vecsize)
				load_expr += ", ";
		}

		if (type.vecsize > 1)
			load_expr += ")";
	}
	else if (!chain.row_major_matrix)
	{
		// Load a matrix, column-major, the easy case.
		const char *load_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			load_op = "Load";
			break;
		case 2:
			load_op = "Load2";
			break;
		case 3:
			load_op = "Load3";
			break;
		case 4:
			load_op = "Load4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_load)
		{
			auto vector_type = type;
			vector_type.columns = 1;
			template_expr = join("<", type_to_glsl(vector_type), ">");
			load_expr = type_to_glsl(type);
			load_op = "Load";
		}
		else
		{
			// Note, this loading style in HLSL is *actually* row-major, but we always treat matrices as transposed in this backend,
			// so row-major is technically column-major ...
			load_expr = type_to_glsl(target_type);
		}
		load_expr += "(";

		for (uint32_t c = 0; c < type.columns; c++)
		{
			load_expr += join(base, ".", load_op, template_expr, "(", chain.dynamic_index,
			                  chain.static_index + c * chain.matrix_stride, ")");
			if (c + 1 < type.columns)
				load_expr += ", ";
		}
		load_expr += ")";
	}
	else
	{
		// Pick out elements one by one ... Hopefully compilers are smart enough to recognize this pattern
		// considering HLSL is "row-major decl", but "column-major" memory layout (basically implicit transpose model, ugh) ...

		if (templated_load)
		{
			load_expr = type_to_glsl(type);
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
		}
		else
			load_expr = type_to_glsl(target_type);

		load_expr += "(";

		for (uint32_t c = 0; c < type.columns; c++)
		{
			for (uint32_t r = 0; r < type.vecsize; r++)
			{
				load_expr += join(base, ".Load", template_expr, "(", chain.dynamic_index,
				                  chain.static_index + c * (type.width / 8) + r * chain.matrix_stride, ")");

				if ((r + 1 < type.vecsize) || (c + 1 < type.columns))
					load_expr += ", ";
			}
		}
		load_expr += ")";
	}

	if (!templated_load)
	{
		auto bitcast_op = bitcast_glsl_op(type, target_type);
		if (!bitcast_op.empty())
			load_expr = join(bitcast_op, "(", load_expr, ")");
	}

	if (lhs.empty())
	{
		assert(expr);
		*expr = std::move(load_expr);
	}
	else
		statement(lhs, " = ", load_expr, ";");
}